

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_psx_Socket.cpp
# Opt level: O2

size_t __thiscall axl::io::psx::Socket::recvFrom(Socket *this,void *p,size_t size,SockAddr *addr)

{
  ssize_t sVar1;
  socklen_t *__addr_len;
  socklen_t addrSize;
  socklen_t local_c;
  
  __addr_len = &local_c;
  local_c = 0x1c;
  if (addr == (SockAddr *)0x0) {
    __addr_len = (socklen_t *)0x0;
  }
  sVar1 = recvfrom((this->super_File).
                   super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,p,size,0,
                   (sockaddr *)addr,__addr_len);
  if ((int)sVar1 == -1) {
    err::setLastSystemError();
  }
  return (long)(int)sVar1;
}

Assistant:

size_t
Socket::recvFrom(
	void* p,
	size_t size,
	SockAddr* addr
) {
	socklen_t addrSize = sizeof(SockAddr);
	int result = ::recvfrom(
		m_h,
		p,
		size,
		0,
		(sockaddr*)addr,
		addr ? &addrSize : NULL
	);

	return err::complete(result, -1);
}